

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPlumeRecord.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::GaussianPlumeRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GaussianPlumeRecord *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tLocation:                     ");
  WorldCoordinates::GetAsString_abi_cxx11_(&local_1e0,&this->m_SrcLocation);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\tOrientation:                  ");
  EulerAngles::GetAsString_abi_cxx11_(&local_200,&this->m_Ori);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"\tPlume Length, Width, Height:  ");
  Vector::GetAsString_abi_cxx11_(&local_220,&this->m_PlumeLWH);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  poVar1 = std::operator<<(poVar1,"\td/dt:                         ");
  Vector::GetAsString_abi_cxx11_(&local_240,&this->m_DDTLEH);
  poVar1 = std::operator<<(poVar1,(string *)&local_240);
  poVar1 = std::operator<<(poVar1,"\tLeading Edge Centroid Height: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32LdEdgeCenHght);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tLeading Edge Velocity:        ");
  Vector::GetAsString_abi_cxx11_(&local_260,&this->m_LdEdgeVel);
  std::operator<<(poVar1,(string *)&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GaussianPlumeRecord::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tLocation:                     " << m_SrcLocation.GetAsString()
       << "\tOrientation:                  " << m_Ori.GetAsString()
       << "\tPlume Length, Width, Height:  " << m_PlumeLWH.GetAsString()
       << "\td/dt:                         " << m_DDTLEH.GetAsString()
       << "\tLeading Edge Centroid Height: " << m_f32LdEdgeCenHght << "\n"
       << "\tLeading Edge Velocity:        " << m_LdEdgeVel.GetAsString();

    return ss.str();
}